

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O0

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
::ArrayMap(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
           *this,GraphType *graph)

{
  bool bVar1;
  DigraphExtender<lemon::SmartDigraphBase> *in_RSI;
  ObserverBase *in_RDI;
  int id;
  Item it;
  Notifier *nf;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  *in_stack_ffffffffffffff88;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  *in_stack_ffffffffffffff90;
  Arc local_44;
  int local_40;
  Node local_38;
  Node local_34;
  Notifier *local_30;
  Node local_14;
  DigraphExtender<lemon::SmartDigraphBase> *local_10;
  
  local_10 = in_RSI;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::ObserverBase::ObserverBase((ObserverBase *)0x2c69fd);
  in_RDI->_vptr_ObserverBase = (_func_int **)&PTR__ArrayMap_00314078;
  std::allocator<lemon::SmartDigraphBase::Arc>::allocator
            ((allocator<lemon::SmartDigraphBase::Arc> *)0x2c6a1e);
  SmartDigraphBase::Node::Node(&local_14);
  DigraphExtender<lemon::SmartDigraphBase>::notifier(local_10,local_14);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::ObserverBase::attach((ObserverBase *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  allocate_memory((ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                   *)in_stack_ffffffffffffff90);
  local_30 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
             ::ObserverBase::notifier(in_RDI);
  SmartDigraphBase::Node::Node(&local_34);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::first(in_stack_ffffffffffffff90,(Item *)in_stack_ffffffffffffff88);
  while( true ) {
    SmartDigraphBase::Node::Node(&local_38);
    bVar1 = SmartDigraphBase::Node::operator!=(&local_34,local_38);
    if (!bVar1) break;
    local_40 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
               ::id(in_stack_ffffffffffffff90,(Item *)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff88 =
         (AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
          *)&in_RDI[1]._index;
    in_stack_ffffffffffffff90 =
         (AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
          *)((long)&(in_RDI[1]._notifier)->container + (long)local_40 * 4);
    SmartDigraphBase::Arc::Arc(&local_44);
    std::allocator_traits<std::allocator<lemon::SmartDigraphBase::Arc>>::
    construct<lemon::SmartDigraphBase::Arc,lemon::SmartDigraphBase::Arc>
              ((allocator_type *)in_stack_ffffffffffffff90,(Arc *)in_stack_ffffffffffffff88,
               (Arc *)0x2c6b0d);
    AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
    ::next(in_stack_ffffffffffffff90,(Item *)in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

explicit ArrayMap(const GraphType& graph) {
    Parent::attach(graph.notifier(Item()));
    allocate_memory();
    Notifier* nf = Parent::notifier();
    Item      it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }